

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[23],unsigned_int,char[21],char_const*,char[71],unsigned_int,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [23],uint *Args_1,
          char (*Args_2) [21],char **Args_3,char (*Args_4) [71],uint *Args_5,char (*Args_6) [2])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[23],unsigned_int,char[21],char_const*,char[71],unsigned_int,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [23])this,(uint *)Args,(char (*) [21])Args_1,(char **)Args_2,
             (char (*) [71])Args_3,(uint *)Args_4,(char (*) [2])Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}